

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O1

wchar_t * create_expanded_text(wchar_t *original_text,TableRow *example_header,TableRow *body_row)

{
  item_delete_function __s;
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  ItemQueue *item_queue;
  size_t sVar4;
  TableCells *pTVar5;
  size_t sVar6;
  Item *pIVar7;
  wchar_t *pwVar8;
  wchar_t *pwVar9;
  int iVar10;
  ulong uVar11;
  QueueItem *pQVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  
  item_queue = ItemQueue_new();
  sVar4 = wcslen(original_text);
  uVar2 = (uint)sVar4;
  if (0 < (int)uVar2) {
    uVar11 = 0;
    do {
      if ((original_text[uVar11] == L'<') &&
         (pTVar5 = example_header->table_cells, L'\0' < pTVar5->cell_count)) {
        lVar14 = 0x18;
        lVar15 = 0;
        do {
          pwVar8 = *(wchar_t **)((long)&pTVar5->table_cells->cell_delete + lVar14);
          sVar6 = wcslen(pwVar8);
          iVar10 = (int)sVar6;
          if (iVar10 < (int)(~(uint)uVar11 + uVar2)) {
            iVar3 = wcsncmp(original_text + uVar11 + 1,pwVar8,(long)iVar10);
            if (iVar3 == 0) {
              pIVar7 = (Item *)malloc(0x18);
              pIVar7->item_delete = ReplacementItem_delete;
              *(uint *)&pIVar7[1].item_delete = (uint)uVar11;
              *(int *)((long)&pIVar7[1].item_delete + 4) = iVar10 + 2;
              pIVar7[2].item_delete =
                   *(item_delete_function *)
                    ((long)&body_row->table_cells->table_cells->cell_delete + lVar14);
              ItemQueue_add(item_queue,pIVar7);
            }
          }
          lVar15 = lVar15 + 1;
          pTVar5 = example_header->table_cells;
          lVar14 = lVar14 + 0x20;
        } while (lVar15 < pTVar5->cell_count);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uVar2 & 0x7fffffff));
  }
  _Var1 = ItemQueue_is_empty(item_queue);
  if (_Var1) {
    pwVar8 = (wchar_t *)malloc((long)((sVar4 << 0x20) + 0x100000000) >> 0x1e);
    wmemcpy(pwVar8,original_text,(long)(int)uVar2);
    pwVar9 = pwVar8 + (int)uVar2;
  }
  else {
    pQVar12 = item_queue->first;
    uVar13 = uVar2;
    if (pQVar12 != (QueueItem *)0x0) {
      uVar11 = sVar4 & 0xffffffff;
      do {
        pIVar7 = pQVar12->item;
        sVar4 = wcslen((wchar_t *)pIVar7[2].item_delete);
        uVar13 = ((int)uVar11 - *(int *)((long)&pIVar7[1].item_delete + 4)) + (int)sVar4;
        uVar11 = (ulong)uVar13;
        pQVar12 = pQVar12->next;
      } while (pQVar12 != (QueueItem *)0x0);
    }
    pwVar8 = (wchar_t *)malloc((long)(int)uVar13 * 4 + 4);
    _Var1 = ItemQueue_is_empty(item_queue);
    if (_Var1) {
      iVar3 = 0;
      lVar14 = 0;
    }
    else {
      iVar10 = 0;
      iVar3 = 0;
      do {
        pIVar7 = ItemQueue_remove(item_queue);
        wmemcpy(pwVar8 + iVar10,original_text + iVar3,
                (long)*(int *)&pIVar7[1].item_delete - (long)iVar3);
        iVar10 = iVar10 + (*(int *)&pIVar7[1].item_delete - iVar3);
        __s = pIVar7[2].item_delete;
        sVar4 = wcslen((wchar_t *)__s);
        wmemcpy(pwVar8 + iVar10,(wchar_t *)__s,sVar4);
        sVar4 = wcslen((wchar_t *)pIVar7[2].item_delete);
        iVar10 = iVar10 + (int)sVar4;
        iVar3 = *(int *)((long)&pIVar7[1].item_delete + 4) + *(int *)&pIVar7[1].item_delete;
        free(pIVar7);
        _Var1 = ItemQueue_is_empty(item_queue);
      } while (!_Var1);
      lVar14 = (long)iVar10;
    }
    if (uVar2 - iVar3 != 0 && iVar3 <= (int)uVar2) {
      wmemcpy(pwVar8 + lVar14,original_text + iVar3,(long)(int)(uVar2 - iVar3));
    }
    pwVar9 = pwVar8 + (int)uVar13;
  }
  *pwVar9 = L'\0';
  ItemQueue_delete(item_queue);
  return pwVar8;
}

Assistant:

static const wchar_t* create_expanded_text(const wchar_t* original_text, const TableRow* example_header, const TableRow* body_row) {
    ItemQueue* replacement_list = ItemQueue_new();
    int length = wcslen(original_text);
    int i;
    for (i = 0; i < length; ++i) {
        if (original_text[i] == L'<') {
            int j;
            for (j = 0; j < example_header->table_cells->cell_count; ++j) {
                int cell_text_length = wcslen(example_header->table_cells->table_cells[j].value);
                if (cell_text_length < length - i - 1 &&
                        wcsncmp(original_text + i + 1, example_header->table_cells->table_cells[j].value, cell_text_length) == 0) {
                    ReplacementItem* item = (ReplacementItem*)malloc(sizeof(ReplacementItem));
                    item->item_delete = (item_delete_function)ReplacementItem_delete;
                    item->start_position = i;
                    item->old_length = cell_text_length + 2;
                    item->new_text = body_row->table_cells->table_cells[j].value;
                    ItemQueue_add(replacement_list, (Item*)item);
                }
            }
        }
    }
    wchar_t* text;
    if (ItemQueue_is_empty(replacement_list)) {
        text = (wchar_t*)malloc((length + 1) * sizeof(wchar_t));
        wmemcpy(text, original_text, length);
        text[length] = L'\0';
    }
    else {
        int new_text_length = length;
        QueueItem* queue_item = replacement_list->first;
        while (queue_item) {
            ReplacementItem* item = (ReplacementItem*)queue_item->item;
            new_text_length += wcslen(item->new_text) - item->old_length;
            queue_item = queue_item->next;
        }
        text = (wchar_t*)malloc((new_text_length + 1) * sizeof(wchar_t));
        int current_src_pos = 0;
        int current_dest_pos = 0;
        while (!ItemQueue_is_empty(replacement_list)) {
            ReplacementItem* item = (ReplacementItem*)ItemQueue_remove(replacement_list);
            wmemcpy(text + current_dest_pos, original_text + current_src_pos, item->start_position - current_src_pos);
            current_dest_pos += item->start_position - current_src_pos;
            wmemcpy(text + current_dest_pos, item->new_text, wcslen(item->new_text));
            current_dest_pos += wcslen(item->new_text);
            current_src_pos += item->start_position - current_src_pos + item->old_length;
            ReplacementItem_delete(item);
        }
        if (current_src_pos < length) {
            wmemcpy(text + current_dest_pos, original_text + current_src_pos, length - current_src_pos);
        }
        text[new_text_length] = L'\0';
    }
    ItemQueue_delete(replacement_list);
    return text;
}